

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O1

void x11_send_init_error(X11Connection *xconn,char *err_message)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  undefined1 *ptr;
  undefined1 uVar3;
  
  __s = dupprintf("%s X11 proxy: %s\n","PSCP",err_message);
  sVar2 = strlen(__s);
  ptr = (undefined1 *)safemalloc((long)((sVar2 << 0x20) + 0xd00000000) >> 0x20,1,0);
  uVar1 = (int)sVar2 + 3;
  *ptr = 0;
  ptr[1] = (char)sVar2;
  *(undefined4 *)(ptr + 2) = *(undefined4 *)(xconn->firstpkt + 2);
  uVar3 = (undefined1)(uVar1 >> 2);
  if (xconn->firstpkt[0] == 'B') {
    ptr[7] = uVar3;
    ptr[6] = (char)(uVar1 >> 10);
  }
  else {
    ptr[6] = uVar3;
    ptr[7] = (char)(uVar1 >> 10);
  }
  memset(ptr + 8,0,(long)(int)(uVar1 & 0xfffffffc));
  memcpy(ptr + 8,__s,(long)(sVar2 << 0x20) >> 0x20);
  (*xconn->c->vt->write)(xconn->c,false,ptr,(long)(int)((uVar1 & 0xfffffffc) + 8));
  (*xconn->c->vt->write_eof)(xconn->c);
  xconn->no_data_sent_to_x_client = false;
  safefree(ptr);
  safefree(__s);
  return;
}

Assistant:

static void x11_send_init_error(struct X11Connection *xconn,
                                const char *err_message)
{
    char *full_message;
    int msglen, msgsize;
    unsigned char *reply;

    full_message = dupprintf("%s X11 proxy: %s\n", appname, err_message);

    msglen = strlen(full_message);
    reply = snewn(8 + msglen+1 + 4, unsigned char); /* include zero */
    msgsize = (msglen + 3) & ~3;
    reply[0] = 0;              /* failure */
    reply[1] = msglen;         /* length of reason string */
    memcpy(reply + 2, xconn->firstpkt + 2, 4);  /* major/minor proto vsn */
    PUT_16BIT_X11(xconn->firstpkt[0], reply + 6, msgsize >> 2);/* data len */
    memset(reply + 8, 0, msgsize);
    memcpy(reply + 8, full_message, msglen);
    sshfwd_write(xconn->c, reply, 8 + msgsize);
    sshfwd_write_eof(xconn->c);
    xconn->no_data_sent_to_x_client = false;
    sfree(reply);
    sfree(full_message);
}